

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O3

void idx2::ForwardCdf53(v3i *M3,int Iter,array<idx2::subband> *Subbands,
                       transform_info *TransformDetails,volume *Vol,bool CoarsestLevel)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  int iVar3;
  transform_info *ptVar4;
  char *__function;
  long lVar5;
  ulong uVar6;
  long lVar7;
  grid *pgVar8;
  undefined3 in_register_00000089;
  byte bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [64];
  grid_iterator<signed_char> It;
  grid_iterator<signed_char> ItEnd;
  grid_iterator<double> local_c0;
  double local_88;
  int local_7c;
  transform_info *local_78;
  array<idx2::subband> *local_70;
  grid_iterator<double> local_68;
  
  local_88 = (double)CONCAT44(local_88._4_4_,CONCAT31(in_register_00000089,CoarsestLevel));
  local_7c = Iter;
  local_70 = Subbands;
  if (TransformDetails->StackSize != 0) {
    pgVar8 = (TransformDetails->StackGrids).Arr;
    uVar6 = 0;
    do {
      if (uVar6 == 0x20) {
        __function = "t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]";
        goto LAB_0018dde6;
      }
      if (Vol->Type < __Invalid__) {
        iVar3 = (TransformDetails->StackAxes).Arr[uVar6];
        switch(Vol->Type) {
        case int8:
          if (iVar3 == 2) {
            FLiftCdf53Z<signed_char>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 1) {
            FLiftCdf53Y<signed_char>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 0) {
            FLiftCdf53X<signed_char>(pgVar8,M3,Normal,Vol);
          }
          break;
        case uint8:
          if (iVar3 == 2) {
            FLiftCdf53Z<unsigned_char>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 1) {
            FLiftCdf53Y<unsigned_char>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 0) {
            FLiftCdf53X<unsigned_char>(pgVar8,M3,Normal,Vol);
          }
          break;
        case int16:
          if (iVar3 == 2) {
            FLiftCdf53Z<short>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 1) {
            FLiftCdf53Y<short>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 0) {
            FLiftCdf53X<short>(pgVar8,M3,Normal,Vol);
          }
          break;
        case uint16:
          if (iVar3 == 2) {
            FLiftCdf53Z<unsigned_short>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 1) {
            FLiftCdf53Y<unsigned_short>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 0) {
            FLiftCdf53X<unsigned_short>(pgVar8,M3,Normal,Vol);
          }
          break;
        case int32:
          if (iVar3 == 2) {
            FLiftCdf53Z<int>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 1) {
            FLiftCdf53Y<int>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 0) {
            FLiftCdf53X<int>(pgVar8,M3,Normal,Vol);
          }
          break;
        case uint32:
          if (iVar3 == 2) {
            FLiftCdf53Z<unsigned_int>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 1) {
            FLiftCdf53Y<unsigned_int>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 0) {
            FLiftCdf53X<unsigned_int>(pgVar8,M3,Normal,Vol);
          }
          break;
        case int64:
          if (iVar3 == 2) {
            FLiftCdf53Z<long>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 1) {
            FLiftCdf53Y<long>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 0) {
            FLiftCdf53X<long>(pgVar8,M3,Normal,Vol);
          }
          break;
        case uint64:
          if (iVar3 == 2) {
            FLiftCdf53Z<unsigned_long>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 1) {
            FLiftCdf53Y<unsigned_long>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 0) {
            FLiftCdf53X<unsigned_long>(pgVar8,M3,Normal,Vol);
          }
          break;
        case float32:
          if (iVar3 == 2) {
            FLiftCdf53Z<float>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 1) {
            FLiftCdf53Y<float>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 0) {
            FLiftCdf53X<float>(pgVar8,M3,Normal,Vol);
          }
          break;
        case float64:
          if (iVar3 == 2) {
            FLiftCdf53Z<double>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 1) {
            FLiftCdf53Y<double>(pgVar8,M3,Normal,Vol);
          }
          else if (iVar3 == 0) {
            FLiftCdf53X<double>(pgVar8,M3,Normal,Vol);
          }
        }
      }
      uVar6 = uVar6 + 1;
      pgVar8 = pgVar8 + 1;
    } while (uVar6 != (uint)TransformDetails->StackSize);
  }
  if (0 < local_70->Size) {
    local_78 = (transform_info *)&(TransformDetails->BasisNorms).WaveNorms;
    lVar7 = 0;
    bVar9 = SUB81(local_88,0);
    auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
    do {
      if ((lVar7 == 0 & (bVar9 ^ 1)) == 0) {
        dVar13 = auVar14._0_8_;
        pgVar8 = (grid *)((local_70->Buffer).Data + lVar7 * 0x40);
        dVar10 = dVar13;
        if ((M3->field_0).field_0.X != 1) {
          iVar3 = (int)*(char *)((long)&pgVar8[2].super_extent.From + 3) +
                  TransformDetails->NPasses * local_7c;
          if (*(char *)((long)&pgVar8[2].super_extent.From + 6) == '\0') {
            if (0x10 < iVar3) goto LAB_0018ddd1;
            iVar3 = iVar3 + -1;
            ptVar4 = TransformDetails;
          }
          else {
            ptVar4 = local_78;
            if (0xf < iVar3) goto LAB_0018ddd1;
          }
          dVar10 = (ptVar4->BasisNorms).ScalNorms.Arr[iVar3];
        }
        dVar12 = dVar13;
        if ((M3->field_0).field_0.Y != 1) {
          iVar3 = (int)*(char *)((long)&pgVar8[2].super_extent.From + 4) +
                  TransformDetails->NPasses * local_7c;
          if (*(char *)((long)&pgVar8[2].super_extent.From + 7) == '\0') {
            if (0x10 < iVar3) goto LAB_0018ddd1;
            iVar3 = iVar3 + -1;
            ptVar4 = TransformDetails;
          }
          else {
            ptVar4 = local_78;
            if (0xf < iVar3) goto LAB_0018ddd1;
          }
          dVar12 = (ptVar4->BasisNorms).ScalNorms.Arr[iVar3];
        }
        if ((M3->field_0).field_0.Z != 1) {
          iVar3 = (int)*(char *)((long)&pgVar8[2].super_extent.From + 5) +
                  TransformDetails->NPasses * local_7c;
          if ((char)pgVar8[2].super_extent.Dims == '\0') {
            if (0x10 < iVar3) goto LAB_0018ddd1;
            iVar3 = iVar3 + -1;
            ptVar4 = TransformDetails;
          }
          else {
            ptVar4 = local_78;
            if (0xf < iVar3) {
LAB_0018ddd1:
              __function = 
              "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]";
LAB_0018dde6:
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,__function);
            }
          }
          dVar13 = (ptVar4->BasisNorms).ScalNorms.Arr[iVar3];
        }
        if (Vol->Type < __Invalid__) {
          local_88 = dVar10 * dVar12 * dVar13;
          switch(Vol->Type) {
          case int8:
            End<signed_char>((grid_iterator<signed_char> *)&local_68,pgVar8,Vol);
            Begin<signed_char>((grid_iterator<signed_char> *)&local_c0,pgVar8,Vol);
            auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *(char *)local_c0.Ptr = (char)(int)(local_88 * (double)(int)*(char *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.S.field_0.field_0.X + (long)local_c0.Ptr);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar5 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               (local_c0.S.field_0.field_0.Y * lVar5 -
                               (long)local_c0.D.field_0.field_0.X));
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 ((long)local_c0.N.field_0.field_0.Y *
                                  local_c0.S.field_0.field_0.Z * lVar5 -
                                 local_c0.D.field_0.field_0.Y * lVar5));
                }
              }
            }
            break;
          case uint8:
            End<unsigned_char>((grid_iterator<unsigned_char> *)&local_68,pgVar8,Vol);
            Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_c0,pgVar8,Vol);
            auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *(char *)local_c0.Ptr = (char)(int)(local_88 * (double)*(byte *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.S.field_0.field_0.X + (long)local_c0.Ptr);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar5 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               (local_c0.S.field_0.field_0.Y * lVar5 -
                               (long)local_c0.D.field_0.field_0.X));
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 ((long)local_c0.N.field_0.field_0.Y *
                                  local_c0.S.field_0.field_0.Z * lVar5 -
                                 local_c0.D.field_0.field_0.Y * lVar5));
                }
              }
            }
            break;
          case int16:
            End<short>((grid_iterator<short> *)&local_68,pgVar8,Vol);
            Begin<short>((grid_iterator<short> *)&local_c0,pgVar8,Vol);
            auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *(short *)pdVar1 = (short)(int)(local_88 * (double)(int)*(short *)pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = (double *)((long)pdVar1 + (long)local_c0.S.field_0.field_0.X * 2);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar5 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = (double *)
                         ((long)pdVar1 +
                         local_c0.S.field_0.field_0.Y * lVar5 * 2 +
                         (long)local_c0.D.field_0.field_0.X * -2);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = (double *)
                           ((long)pdVar1 +
                           (long)local_c0.N.field_0.field_0.Y * local_c0.S.field_0.field_0.Z * lVar5
                           * 2 + local_c0.D.field_0.field_0.Y * lVar5 * -2);
                }
              }
            }
            break;
          case uint16:
            End<unsigned_short>((grid_iterator<unsigned_short> *)&local_68,pgVar8,Vol);
            Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_c0,pgVar8,Vol);
            auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *(short *)pdVar1 = (short)(int)(local_88 * (double)*(ushort *)pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = (double *)((long)pdVar1 + (long)local_c0.S.field_0.field_0.X * 2);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar5 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = (double *)
                         ((long)pdVar1 +
                         local_c0.S.field_0.field_0.Y * lVar5 * 2 +
                         (long)local_c0.D.field_0.field_0.X * -2);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = (double *)
                           ((long)pdVar1 +
                           (long)local_c0.N.field_0.field_0.Y * local_c0.S.field_0.field_0.Z * lVar5
                           * 2 + local_c0.D.field_0.field_0.Y * lVar5 * -2);
                }
              }
            }
            break;
          case int32:
            End<int>((grid_iterator<int> *)&local_68,pgVar8,Vol);
            Begin<int>((grid_iterator<int> *)&local_c0,pgVar8,Vol);
            auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *(int *)pdVar1 = (int)(local_88 * (double)(int)*(float *)pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = (double *)((long)pdVar1 + (long)local_c0.S.field_0.field_0.X * 4);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar5 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = (double *)
                         ((long)pdVar1 +
                         local_c0.S.field_0.field_0.Y * lVar5 * 4 +
                         (long)local_c0.D.field_0.field_0.X * -4);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = (double *)
                           ((long)pdVar1 +
                           (long)local_c0.N.field_0.field_0.Y * local_c0.S.field_0.field_0.Z * lVar5
                           * 4 + local_c0.D.field_0.field_0.Y * lVar5 * -4);
                }
              }
            }
            break;
          case uint32:
            End<unsigned_int>((grid_iterator<unsigned_int> *)&local_68,pgVar8,Vol);
            Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_c0,pgVar8,Vol);
            auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *(float *)pdVar1 = (float)(long)(local_88 * (double)(uint)*(float *)pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = (double *)((long)pdVar1 + (long)local_c0.S.field_0.field_0.X * 4);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar5 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = (double *)
                         ((long)pdVar1 +
                         local_c0.S.field_0.field_0.Y * lVar5 * 4 +
                         (long)local_c0.D.field_0.field_0.X * -4);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = (double *)
                           ((long)pdVar1 +
                           (long)local_c0.N.field_0.field_0.Y * local_c0.S.field_0.field_0.Z * lVar5
                           * 4 + local_c0.D.field_0.field_0.Y * lVar5 * -4);
                }
              }
            }
            break;
          case int64:
            End<long>((grid_iterator<long> *)&local_68,pgVar8,Vol);
            Begin<long>((grid_iterator<long> *)&local_c0,pgVar8,Vol);
            auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *pdVar1 = (double)(long)(local_88 * (double)(long)*pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = pdVar1 + local_c0.S.field_0.field_0.X;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar5 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = pdVar1 + (local_c0.S.field_0.field_0.Y * lVar5 -
                                  (long)local_c0.D.field_0.field_0.X);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = pdVar1 + ((long)local_c0.N.field_0.field_0.Y *
                                     local_c0.S.field_0.field_0.Z * lVar5 -
                                    local_c0.D.field_0.field_0.Y * lVar5);
                }
              }
            }
            break;
          case uint64:
            End<unsigned_long>((grid_iterator<unsigned_long> *)&local_68,pgVar8,Vol);
            Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_c0,pgVar8,Vol);
            auVar2 = _DAT_001a8f70;
            auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              auVar11._8_8_ = 0;
              auVar11._0_8_ = *pdVar1;
              auVar11 = vunpcklps_avx(auVar11,ZEXT816(0x4530000043300000));
              auVar11 = vsubpd_avx(auVar11,auVar2);
              dVar10 = local_88 * (auVar11._0_8_ + auVar11._8_8_);
              uVar6 = (ulong)dVar10;
              *pdVar1 = (double)((long)(dVar10 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f |
                                uVar6);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = pdVar1 + local_c0.S.field_0.field_0.X;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar5 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = pdVar1 + (local_c0.S.field_0.field_0.Y * lVar5 -
                                  (long)local_c0.D.field_0.field_0.X);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = pdVar1 + ((long)local_c0.N.field_0.field_0.Y *
                                     local_c0.S.field_0.field_0.Z * lVar5 -
                                    local_c0.D.field_0.field_0.Y * lVar5);
                }
              }
            }
            break;
          case float32:
            End<float>((grid_iterator<float> *)&local_68,pgVar8,Vol);
            Begin<float>((grid_iterator<float> *)&local_c0,pgVar8,Vol);
            auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *(float *)pdVar1 = (float)(local_88 * (double)*(float *)pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = (double *)((long)pdVar1 + (long)local_c0.S.field_0.field_0.X * 4);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar5 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = (double *)
                         ((long)pdVar1 +
                         local_c0.S.field_0.field_0.Y * lVar5 * 4 +
                         (long)local_c0.D.field_0.field_0.X * -4);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = (double *)
                           ((long)pdVar1 +
                           (long)local_c0.N.field_0.field_0.Y * local_c0.S.field_0.field_0.Z * lVar5
                           * 4 + local_c0.D.field_0.field_0.Y * lVar5 * -4);
                }
              }
            }
            break;
          case float64:
            End<double>(&local_68,pgVar8,Vol);
            Begin<double>(&local_c0,pgVar8,Vol);
            auVar14 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *pdVar1 = local_88 * *pdVar1;
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = pdVar1 + local_c0.S.field_0.field_0.X;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar5 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = pdVar1 + (local_c0.S.field_0.field_0.Y * lVar5 -
                                  (long)local_c0.D.field_0.field_0.X);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = pdVar1 + ((long)local_c0.N.field_0.field_0.Y *
                                     local_c0.S.field_0.field_0.Z * lVar5 -
                                    local_c0.D.field_0.field_0.Y * lVar5);
                }
              }
            }
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_70->Size);
  }
  return;
}

Assistant:

void
ForwardCdf53(const v3i& M3,
             int Iter,
             const array<subband>& Subbands,
             const transform_info& TransformDetails,
             volume* Vol,
             bool CoarsestLevel)
{
  idx2_For (int, I, 0, TransformDetails.StackSize)
  {
    int D = TransformDetails.StackAxes[I];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      FLiftCdf53X<type>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                           \
      break;                                                                                       \
    case 1:                                                                                        \
      FLiftCdf53Y<type>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                           \
      break;                                                                                       \
    case 2:                                                                                        \
      FLiftCdf53Z<type>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                           \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }

  /* Optionally normalize */
  idx2_Assert(IsFloatingPoint(Vol->Type));
  for (int I = 0; I < Size(Subbands); ++I)
  {
    if (I == 0 && !CoarsestLevel)
      continue; // do not normalize subband 0
    subband& S = Subbands[I];
    f64 Wx = M3.X == 1
               ? 1
               : (S.LowHigh3.X == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X]);
    f64 Wy = M3.Y == 1
               ? 1
               : (S.LowHigh3.Y == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y]);
    f64 Idx2 = M3.Z == 1 ? 1
                         : (S.LowHigh3.Z == 0
                              ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z - 1]
                              : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z]);
    f64 W = Wx * Wy * Idx2;
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}